

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

void __thiscall re2::Regexp::ParseState::~ParseState(ParseState *this)

{
  Regexp *pRVar1;
  undefined8 *puVar2;
  Regexp *this_00;
  
  this_00 = this->stacktop_;
  while (this_00 != (Regexp *)0x0) {
    pRVar1 = this_00->down_;
    this_00->down_ = (Regexp *)0x0;
    if (this_00->op_ == '\x16') {
      puVar2 = (undefined8 *)(this_00->field_7).the_union_[1];
      if ((puVar2 != (undefined8 *)0x0) && ((undefined8 *)*puVar2 != puVar2 + 2)) {
        operator_delete((undefined8 *)*puVar2);
      }
      operator_delete(puVar2);
    }
    Decref(this_00);
    this_00 = pRVar1;
  }
  return;
}

Assistant:

Regexp::ParseState::~ParseState() {
  Regexp* next;
  for (Regexp* re = stacktop_; re != NULL; re = next) {
    next = re->down_;
    re->down_ = NULL;
    if (re->op() == kLeftParen)
      delete re->name_;
    re->Decref();
  }
}